

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Progress.cpp
# Opt level: O2

void __thiscall Progress::renderStyleMono(Progress *this)

{
  long lVar1;
  long lVar2;
  size_type sVar3;
  time_t tVar4;
  ostream *poVar5;
  long lVar6;
  string *this_00;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Progress *in_RSI;
  uint uVar11;
  double dVar12;
  string estimate_time;
  string elapsed_time;
  string local_50;
  
  lVar6 = this->current;
  lVar1 = this->minimum;
  lVar2 = this->maximum;
  tVar4 = time((time_t *)0x0);
  elapsed_time._M_dataplus._M_p = (pointer)&elapsed_time.field_2;
  elapsed_time._M_string_length = 0;
  elapsed_time.field_2._M_local_buf[0] = '\0';
  if ((this->elapsed == true) && (this->start != 0)) {
    formatTime_abi_cxx11_(&estimate_time,in_RSI,tVar4 - this->start);
    in_RSI = (Progress *)&estimate_time;
    std::__cxx11::string::operator=((string *)&elapsed_time,(string *)&estimate_time);
    std::__cxx11::string::~string((string *)&estimate_time);
  }
  estimate_time._M_dataplus._M_p = (pointer)&estimate_time.field_2;
  estimate_time._M_string_length = 0;
  dVar12 = (double)(lVar6 - lVar1) / (double)(lVar2 - lVar1);
  estimate_time.field_2._M_local_buf[0] = '\0';
  if ((this->estimate == true) && (this->start != 0)) {
    if (1e-06 <= dVar12) {
      formatTime_abi_cxx11_
                (&local_50,in_RSI,
                 (long)(int)(((1.0 - dVar12) * (double)(tVar4 - this->start)) / dVar12));
    }
    else {
      formatTime_abi_cxx11_(&local_50,in_RSI,0);
    }
    std::__cxx11::string::operator=((string *)&estimate_time,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  sVar3 = (this->label)._M_string_length;
  iVar9 = -1;
  iVar8 = -6;
  if (this->percentage == false) {
    iVar8 = -1;
  }
  iVar7 = (int)sVar3;
  if (sVar3 == 0) {
    iVar7 = -1;
  }
  iVar10 = -1;
  if (this->elapsed != false) {
    iVar10 = (int)elapsed_time._M_string_length;
  }
  if (this->estimate != false) {
    iVar9 = (int)estimate_time._M_string_length;
  }
  iVar9 = ((iVar8 + this->width) - (iVar7 + iVar10 + iVar9)) + -2;
  if (0 < iVar9) {
    if (sVar3 != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)&this->label);
      std::operator<<(poVar5,' ');
    }
    uVar11 = (uint)((double)iVar9 * dVar12);
    if (0 < (int)uVar11) {
      poVar5 = std::operator<<((ostream *)&std::cout,"\x1b[47m");
      poVar5 = std::operator<<(poVar5,0x20);
      *(ulong *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = (ulong)uVar11;
      std::operator<<(poVar5,' ');
    }
    if (iVar9 - uVar11 != 0 && (int)uVar11 <= iVar9) {
      poVar5 = std::operator<<((ostream *)&std::cout,"\x1b[40m");
      poVar5 = std::operator<<(poVar5,0x20);
      *(ulong *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = (ulong)(iVar9 - uVar11);
      std::operator<<(poVar5,' ');
    }
    std::operator<<((ostream *)&std::cout,"\x1b[0m");
    if (this->percentage == true) {
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      poVar5 = std::operator<<(poVar5,0x20);
      *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 3;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)(dVar12 * 100.0));
      std::operator<<(poVar5,"%");
    }
    lVar6 = this->start;
    if ((lVar6 != 0 & this->elapsed) == 1) {
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      std::operator<<(poVar5,(string *)&elapsed_time);
      lVar6 = this->start;
    }
    if ((this->estimate == true) && (lVar6 != 0)) {
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      std::operator<<(poVar5,(string *)&estimate_time);
    }
    std::operator<<((ostream *)&std::cout,"\r");
    std::ostream::flush();
    std::__cxx11::string::~string((string *)&estimate_time);
    std::__cxx11::string::~string((string *)&elapsed_time);
    return;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,"The specified width is insufficient.",(allocator<char> *)&local_50);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void Progress::renderStyleMono ()
{
  // Fraction completed.
  double fraction = (1.0 * (current - minimum)) / (maximum - minimum);

  // Elapsed time.
  time_t now = time (NULL);
  std::string elapsed_time;
  if (elapsed && start != 0)
    elapsed_time = formatTime (now - start);

  // Estimated remaining time.
  std::string estimate_time;
  if (estimate && start != 0)
  {
    if (fraction >= 1e-6)
      estimate_time = formatTime ((time_t) (int) (((now - start) * (1.0 - fraction)) / fraction));
    else
      estimate_time = formatTime (0);
  }

  // Calculate bar width.
  int bar = width
          - (label.length () ? label.length () + 1         : 0)
          - (percentage      ? 5                           : 0)
          - (elapsed         ? elapsed_time.length () + 1  : 0)
          - (estimate        ? estimate_time.length () + 1 : 0);

  if (bar < 1)
    throw std::string ("The specified width is insufficient.");

  int visible = (int) (fraction * bar);

  // Render.
  if (label.length ())
    std::cout << label
              << ' ';

  if (visible > 0)
    std::cout << "\033[47m" // White
              << std::setfill (' ')
              << std::setw (visible)
              << ' ';

  if (bar - visible > 0)
    std::cout << "\033[40m" // Black
              << std::setfill (' ')
              << std::setw (bar - visible)
              << ' ';

  std::cout << "\033[0m";

  if (percentage)
    std::cout << " "
              << std::setfill (' ')
              << std::setw (3)
              << (int) (fraction * 100)
              << "%";

  if (elapsed && start != 0)
    std::cout << " "
              << elapsed_time;

  if (estimate && start != 0)
    std::cout << " "
              << estimate_time;

  std::cout << "\r"
            << std::flush;
}